

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow **__src;
  ImGuiWindow *in_RDI;
  int i;
  ImGuiContext *g;
  int local_14;
  
  pIVar1 = GImGui;
  ppIVar2 = ImVector<ImGuiWindow_*>::back(&GImGui->WindowsFocusOrder);
  if (*ppIVar2 != in_RDI) {
    for (local_14 = (pIVar1->WindowsFocusOrder).Size + -2; -1 < local_14; local_14 = local_14 + -1)
    {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_14);
      if (*ppIVar2 == in_RDI) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_14);
        __src = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_14 + 1);
        memmove(ppIVar2,__src,(long)(((pIVar1->WindowsFocusOrder).Size - local_14) + -1) << 3);
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[]
                            (&pIVar1->WindowsFocusOrder,(pIVar1->WindowsFocusOrder).Size + -1);
        *ppIVar2 = in_RDI;
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.WindowsFocusOrder.back() == window)
        return;
    for (int i = g.WindowsFocusOrder.Size - 2; i >= 0; i--) // We can ignore the front most window
        if (g.WindowsFocusOrder[i] == window)
        {
            memmove(&g.WindowsFocusOrder[i], &g.WindowsFocusOrder[i + 1], (size_t)(g.WindowsFocusOrder.Size - i - 1) * sizeof(ImGuiWindow*));
            g.WindowsFocusOrder[g.WindowsFocusOrder.Size - 1] = window;
            break;
        }
}